

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_include_file_time_w(archive *_a,wchar_t flag,wchar_t *pathname)

{
  wchar_t wVar1;
  undefined8 in_RDX;
  undefined4 in_ESI;
  wchar_t r;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  wVar1 = validate_time_flag((archive *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                             (wchar_t)((ulong)in_RDX >> 0x20),
                             (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (wVar1 == L'\0') {
    wVar1 = set_timefilter_pathname_wcs
                      ((archive_match *)pathname,r,
                       (wchar_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  return wVar1;
}

Assistant:

int
archive_match_include_file_time_w(struct archive *_a, int flag,
    const wchar_t *pathname)
{
	int r;

	r = validate_time_flag(_a, flag, "archive_match_include_file_time_w");
	if (r != ARCHIVE_OK)
		return (r);
	return set_timefilter_pathname_wcs((struct archive_match *)_a,
			flag, pathname);
}